

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleset.cpp
# Opt level: O2

bool __thiscall Ruleset::isTrump(Ruleset *this,Card *card)

{
  pointer ppRVar1;
  uint uVar2;
  pointer ppRVar3;
  
  ppRVar1 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar2 = 0;
  for (ppRVar3 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppRVar3 != ppRVar1; ppRVar3 = ppRVar3 + 1) {
    uVar2 = (**(*ppRVar3)->_vptr_Rule)(*ppRVar3,(ulong)(uVar2 & 1),card);
  }
  return (bool)((byte)uVar2 & 1);
}

Assistant:

bool Ruleset::isTrump(const Card &card) {
    bool previous = false;
    for(auto rule : m_ruleInstances){
        previous = rule->isTrump(previous, card);
    }
    return previous;
}